

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_solvers_3x3_nonnumeric::test_method(test_solvers_3x3_nonnumeric *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_b8;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  local_a0;
  size_t expected_assignment [3];
  seconds costs [9];
  
  costs[0].rep_ = 1;
  costs[1].rep_ = 2;
  costs[2].rep_ = 4;
  costs[3].rep_ = 0;
  costs[4].rep_ = 2;
  costs[5].rep_ = -1;
  costs[6].rep_ = 3;
  costs[7].rep_ = 0;
  costs[8].rep_ = -3;
  expected_assignment[0] = 1;
  expected_assignment[1] = 0;
  expected_assignment[2] = 2;
  make_matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>>(&local_a0,costs,3,3);
  make_vector<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_b8,expected_assignment
             ,3);
  assert_solvers_result<boost::chrono::duration<long,boost::ratio<1l,1l>>>
            (&local_a0,(duration<long,_boost::ratio<1L,_1L>_>)0xffffffffffffffff,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_b8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_b8);
  boost::numeric::ublas::
  unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  ::~unbounded_array(&local_a0.data_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_3x3_nonnumeric)
{
  using boost::chrono::seconds;
  const seconds costs[] = {seconds(1), seconds(2), seconds(4),
                           seconds(0), seconds(2), seconds(-1),
                           seconds(3), seconds(0), seconds(-3)};
  const std::size_t expected_assignment[] = {1, 0, 2};
  assert_solvers_result(make_matrix(costs, 3, 3), seconds(-1), make_vector(expected_assignment, 3));
}